

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O2

ByteBuffer * __thiscall
bidfx_public_api::price::pixie::LoginMessage::Encode
          (ByteBuffer *__return_storage_ptr__,LoginMessage *this,int version)

{
  OutputStream *stream;
  long lVar1;
  size_t size;
  ByteBuffer message_frame;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  ByteBuffer local_60;
  
  lVar1 = 0;
  if (1 < version) {
    lVar1 = (this->application_version_)._M_string_length + (this->application_)._M_string_length;
  }
  size = lVar1 + (this->username_)._M_string_length + (this->alias_)._M_string_length +
                 (this->password_)._M_string_length * 2 + 1;
  if (3 < version) {
    size = size + (this->api_)._M_string_length + (this->api_version_)._M_string_length +
           (this->product_)._M_string_length + (this->product_serial_number_)._M_string_length;
  }
  tools::ByteBuffer::ByteBuffer(&local_60,size);
  tools::ByteBuffer::WriteByte(&local_60,'L');
  std::__cxx11::string::string((string *)&local_80,(string *)&this->username_);
  stream = &local_60.super_OutputStream;
  tools::Varint::WriteString(stream,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,(string *)&this->password_);
  tools::Varint::WriteString(stream,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,(string *)&this->alias_);
  tools::Varint::WriteString(stream,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (1 < version) {
    std::__cxx11::string::string((string *)&local_e0,(string *)&this->application_);
    tools::Varint::WriteString(stream,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string((string *)&local_100,(string *)&this->application_version_);
    tools::Varint::WriteString(stream,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  if (3 < version) {
    std::__cxx11::string::string((string *)&local_120,(string *)&this->api_);
    tools::Varint::WriteString(stream,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string((string *)&local_140,(string *)&this->api_version_);
    tools::Varint::WriteString(stream,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string((string *)&local_160,(string *)&this->product_);
    tools::Varint::WriteString(stream,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::string((string *)&local_180,(string *)&this->product_serial_number_);
    tools::Varint::WriteString(stream,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
  }
  tools::ByteBuffer::ByteBuffer(__return_storage_ptr__,&local_60);
  tools::ByteBuffer::~ByteBuffer(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteBuffer LoginMessage::Encode(int version) const
{
    size_t message_len = sizeof(PixieMessageType::LOGIN) + sizeof(unsigned char) * username_.size() +
                      sizeof(unsigned char) * password_.size() + sizeof(unsigned char) * alias_.size() +
                      sizeof(unsigned char) * password_.size();

    bool version2 = version >= PixieVersion::VERSION2;
    if (version2)
    {
        message_len += sizeof(unsigned char) * application_.size() + sizeof(unsigned char) * application_version_.size();
    }

    bool version4 = version >= PixieVersion::VERSION4;
    if (version4)
    {
        message_len += sizeof(unsigned char) * api_.size() + sizeof(unsigned char) * api_version_.size() +
                       sizeof(unsigned char) * product_.size() + sizeof(unsigned char) * product_serial_number_.size();
    }

    ByteBuffer message_frame(message_len);
    message_frame.WriteByte(PixieMessageType::LOGIN);
    Varint::WriteString(message_frame, username_);
    Varint::WriteString(message_frame, password_);
    Varint::WriteString(message_frame, alias_);

    if (version2)
    {
        Varint::WriteString(message_frame, application_);
        Varint::WriteString(message_frame, application_version_);
    }

    if (version4)
    {
        Varint::WriteString(message_frame, api_);
        Varint::WriteString(message_frame, api_version_);
        Varint::WriteString(message_frame, product_);
        Varint::WriteString(message_frame, product_serial_number_);
    }

    return std::move(message_frame);
}